

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void snap_restoreval(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref
                    ,TValue *o)

{
  uint rs_00;
  uint uVar1;
  double *pdVar2;
  SnapNo in_ECX;
  GCtrace *in_RDX;
  jit_State *in_RSI;
  ulong in_R8;
  uint in_R9D;
  TValue *unaff_retaddr;
  double *in_stack_00000008;
  Reg r;
  int32_t *sps;
  RegSP rs;
  IRType1 t;
  IRIns *ir;
  IRIns *in_stack_fffffffffffffee8;
  undefined3 in_stack_fffffffffffffef4;
  undefined4 uVar3;
  byte bVar4;
  IRIns *L;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  
  L = (in_RSI->cur).ir + in_R9D;
  uVar3 = CONCAT13((L->field_1).t.irt,in_stack_fffffffffffffef4);
  rs_00 = (uint)(L->field_0).prev;
  if (in_R9D < 0x8000) {
    if ((L->field_1).o == '\x19') {
      *in_stack_00000008 = (double)(ulong)((GCRef *)&(L->field_1).op12)->gcptr32;
    }
    else {
      lj_ir_kvalue((lua_State *)&L->field_0,(TValue *)CONCAT44(uVar3,rs_00),
                   in_stack_fffffffffffffee8);
    }
  }
  else {
    if ((in_R8 & 1L << ((byte)in_R9D & 0x3f)) != 0) {
      rs_00 = snap_renameref(&in_RSI->cur,in_ECX,in_R9D,rs_00);
    }
    bVar4 = (byte)((uint)uVar3 >> 0x18);
    if (rs_00 >> 8 == 0) {
      uVar1 = rs_00 & 0xff;
      if ((rs_00 & 0x80) == 0) {
        if ((bVar4 & 0x1f) - 0xf < 5) {
          *in_stack_00000008 = (double)(int)(&in_RDX[1].snap)[uVar1];
        }
        else if ((bVar4 & 0x1f) == 0xe) {
          *in_stack_00000008 = *(double *)(&in_RDX->nextgc + (ulong)(uVar1 - 0x10) * 2);
        }
        else if ((0x604208U >> (bVar4 & 0x1f) & 1) == 0) {
          if ((bVar4 & 0x1f) < 3) {
            *(uint *)((long)in_stack_00000008 + 4) = bVar4 & 0x1f ^ 0xffffffff;
          }
          else {
            *(int *)in_stack_00000008 = (int)(&in_RDX[1].snap)[uVar1];
            *(uint *)((long)in_stack_00000008 + 4) = bVar4 & 0x1f ^ 0xffffffff;
          }
        }
        else {
          *in_stack_00000008 = (double)(&in_RDX[1].snap)[uVar1];
        }
      }
      else {
        snap_restoreval(in_RSI,in_RDX,(ExitState *)CONCAT44(in_ECX,in_stack_ffffffffffffff10),
                        (SnapNo)(in_R8 >> 0x20),CONCAT44(in_R9D,in_stack_ffffffffffffff00),
                        (IRRef)((ulong)L >> 0x20),unaff_retaddr);
      }
    }
    else {
      pdVar2 = (double *)((long)&in_RDX[2].mcode + (ulong)(rs_00 >> 8) * 4);
      if ((bVar4 & 0x1f) - 0xf < 5) {
        *in_stack_00000008 = (double)*(int *)pdVar2;
      }
      else if ((bVar4 & 0x1f) == 0xe) {
        *in_stack_00000008 = *pdVar2;
      }
      else if ((bVar4 & 0x1f) == 3) {
        *in_stack_00000008 = *pdVar2;
      }
      else {
        *(int *)in_stack_00000008 = *(int *)pdVar2;
        *(uint *)((long)in_stack_00000008 + 4) = bVar4 & 0x1f ^ 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

static void snap_restoreval(jit_State *J, GCtrace *T, ExitState *ex,
			    SnapNo snapno, BloomFilter rfilt,
			    IRRef ref, TValue *o)
{
  IRIns *ir = &T->ir[ref];
  IRType1 t = ir->t;
  RegSP rs = ir->prev;
  if (irref_isk(ref)) {  /* Restore constant slot. */
    if (ir->o == IR_KPTR) {
      o->u64 = (uint64_t)(uintptr_t)ir_kptr(ir);
    } else {
      lj_assertJ(!(ir->o == IR_KKPTR || ir->o == IR_KNULL),
		 "restore of const from IR %04d with bad op %d",
		 ref - REF_BIAS, ir->o);
      lj_ir_kvalue(J->L, o, ir);
    }
    return;
  }
  if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
    rs = snap_renameref(T, snapno, ref, rs);
  if (ra_hasspill(regsp_spill(rs))) {  /* Restore from spill slot. */
    int32_t *sps = &ex->spill[regsp_spill(rs)];
    if (irt_isinteger(t)) {
      setintV(o, *sps);
#if !LJ_SOFTFP32
    } else if (irt_isnum(t)) {
      o->u64 = *(uint64_t *)sps;
#endif
#if LJ_64 && !LJ_GC64
    } else if (irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = *(uint64_t *)sps;
#endif
    } else {
      lj_assertJ(!irt_ispri(t), "PRI ref with spill slot");
      setgcV(J->L, o, (GCobj *)(uintptr_t)*(GCSize *)sps, irt_toitype(t));
    }
  } else {  /* Restore from register. */
    Reg r = regsp_reg(rs);
    if (ra_noreg(r)) {
      lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		 "restore from IR %04d has no reg", ref - REF_BIAS);
      snap_restoreval(J, T, ex, snapno, rfilt, ir->op1, o);
      if (LJ_DUALNUM) setnumV(o, (lua_Number)intV(o));
      return;
    } else if (irt_isinteger(t)) {
      setintV(o, (int32_t)ex->gpr[r-RID_MIN_GPR]);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      setnumV(o, ex->fpr[r-RID_MIN_FPR]);
#elif LJ_64  /* && LJ_SOFTFP */
    } else if (irt_isnum(t)) {
      o->u64 = ex->gpr[r-RID_MIN_GPR];
#endif
#if LJ_64 && !LJ_GC64
    } else if (irt_is64(t)) {
      /* 64 bit values that already have the tag bits. */
      o->u64 = ex->gpr[r-RID_MIN_GPR];
#endif
    } else if (irt_ispri(t)) {
      setpriV(o, irt_toitype(t));
    } else {
      setgcV(J->L, o, (GCobj *)ex->gpr[r-RID_MIN_GPR], irt_toitype(t));
    }
  }
}